

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O2

String * __thiscall
glcts::LayoutBindingProgram::getErrorLog_abi_cxx11_
          (String *__return_storage_ptr__,LayoutBindingProgram *this,bool dumpShaders)

{
  ShaderProgram *pSVar1;
  Shader *pSVar2;
  Shader *pSVar3;
  int iVar4;
  eStageType eVar5;
  ostream *poVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  uint uVar7;
  char *pcVar8;
  String msg;
  String local_1c8;
  StringStream errLog;
  
  StringStream::StringStream(&errLog);
  iVar4 = (*this->_vptr_LayoutBindingProgram[2])(this);
  pSVar1 = this->m_program;
  if (iVar4 == 2) {
    pSVar2 = *pSVar1->m_shaders[5].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (((pSVar2->m_info).compileOk != true) ||
       ((byte)((pSVar1->m_program).m_info.linkOk ^ 1U | dumpShaders) == 1)) {
      poVar6 = std::operator<<((ostream *)&errLog,"### dump of ");
      stageToName_abi_cxx11_(&msg,this,ComputeShader);
      poVar6 = std::operator<<(poVar6,(string *)&msg);
      std::operator<<(poVar6,"###\n");
      std::__cxx11::string::~string((string *)&msg);
      pcVar8 = "Compute shader compile failed while testing ";
      if (dumpShaders) {
        pcVar8 = "Compute shader should not have compiled";
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&msg,pcVar8,(allocator<char> *)&local_1c8);
      poVar6 = std::operator<<((ostream *)&errLog,(string *)&msg);
      stageToName_abi_cxx11_(&local_1c8,this,ComputeShader);
      poVar6 = std::operator<<(poVar6,(string *)&local_1c8);
      poVar6 = std::operator<<(poVar6,": ");
      poVar6 = std::operator<<(poVar6,(string *)&(pSVar2->m_info).infoLog);
      std::operator<<(poVar6,"\n");
      std::__cxx11::string::~string((string *)&local_1c8);
      iVar4 = (*this->m_contextSupplier->_vptr_IProgramContextSupplier[5])
                        (this->m_contextSupplier,2);
      std::operator<<((ostream *)&errLog,(string *)CONCAT44(extraout_var,iVar4));
LAB_00bea759:
      std::__cxx11::string::~string((string *)&msg);
    }
  }
  else {
    pSVar2 = *pSVar1->m_shaders[1].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pSVar3 = *pSVar1->m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (((pSVar2->m_info).compileOk != true) ||
       ((byte)((pSVar1->m_program).m_info.linkOk ^ 1U | dumpShaders) == 1)) {
      poVar6 = std::operator<<((ostream *)&errLog,"### dump of ");
      stageToName_abi_cxx11_(&msg,this,FragmentShader);
      poVar6 = std::operator<<(poVar6,(string *)&msg);
      std::operator<<(poVar6,"###\n");
      std::__cxx11::string::~string((string *)&msg);
      pcVar8 = "Vertex shader compile failed while testing ";
      if (dumpShaders) {
        pcVar8 = "Fragment shader should not have compiled";
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&msg,pcVar8,(allocator<char> *)&local_1c8);
      poVar6 = std::operator<<((ostream *)&errLog,"Fragment shader compile failed while testing ");
      eVar5 = (*this->_vptr_LayoutBindingProgram[2])(this);
      stageToName_abi_cxx11_(&local_1c8,this,eVar5);
      poVar6 = std::operator<<(poVar6,(string *)&local_1c8);
      poVar6 = std::operator<<(poVar6,": ");
      poVar6 = std::operator<<(poVar6,(string *)&(pSVar2->m_info).infoLog);
      std::operator<<(poVar6,"\n");
      std::__cxx11::string::~string((string *)&local_1c8);
      iVar4 = (*this->m_contextSupplier->_vptr_IProgramContextSupplier[5])
                        (this->m_contextSupplier,1);
      std::operator<<((ostream *)&errLog,(string *)CONCAT44(extraout_var_00,iVar4));
      std::__cxx11::string::~string((string *)&msg);
    }
    if (((pSVar3->m_info).compileOk != true) ||
       ((byte)((this->m_program->m_program).m_info.linkOk ^ 1U | dumpShaders) == 1)) {
      poVar6 = std::operator<<((ostream *)&errLog,"### dump of ");
      stageToName_abi_cxx11_(&msg,this,VertexShader);
      poVar6 = std::operator<<(poVar6,(string *)&msg);
      std::operator<<(poVar6,"###\n");
      std::__cxx11::string::~string((string *)&msg);
      pcVar8 = "Vertex shader compile failed while testing ";
      if (dumpShaders) {
        pcVar8 = "Vertex shader should not have compiled";
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&msg,pcVar8,(allocator<char> *)&local_1c8);
      poVar6 = std::operator<<((ostream *)&errLog,(string *)&msg);
      eVar5 = (*this->_vptr_LayoutBindingProgram[2])(this);
      stageToName_abi_cxx11_(&local_1c8,this,eVar5);
      poVar6 = std::operator<<(poVar6,(string *)&local_1c8);
      poVar6 = std::operator<<(poVar6,": ");
      poVar6 = std::operator<<(poVar6,(string *)&(pSVar3->m_info).infoLog);
      std::operator<<(poVar6,"\n");
      std::__cxx11::string::~string((string *)&local_1c8);
      iVar4 = (*this->m_contextSupplier->_vptr_IProgramContextSupplier[5])
                        (this->m_contextSupplier,0);
      std::operator<<((ostream *)&errLog,(string *)CONCAT44(extraout_var_01,iVar4));
      goto LAB_00bea759;
    }
  }
  if ((this->m_program->m_program).m_info.linkOk != false) goto LAB_00bea964;
  (*this->_vptr_LayoutBindingProgram[2])(this);
  poVar6 = std::operator<<((ostream *)&errLog,"Linking failed while testing ");
  eVar5 = (*this->_vptr_LayoutBindingProgram[2])(this);
  stageToName_abi_cxx11_(&msg,this,eVar5);
  poVar6 = std::operator<<(poVar6,(string *)&msg);
  poVar6 = std::operator<<(poVar6,": ");
  poVar6 = std::operator<<(poVar6,(string *)&(this->m_program->m_program).m_info);
  std::operator<<(poVar6,"\n");
  std::__cxx11::string::~string((string *)&msg);
  std::operator<<((ostream *)&errLog,"### other stages ###\n");
  iVar4 = (*this->_vptr_LayoutBindingProgram[2])(this);
  if (iVar4 == 0) {
    poVar6 = std::operator<<((ostream *)&errLog,"### dump of ");
    stageToName_abi_cxx11_(&msg,this,FragmentShader);
    poVar6 = std::operator<<(poVar6,(string *)&msg);
    std::operator<<(poVar6,"###\n");
    std::__cxx11::string::~string((string *)&msg);
    uVar7 = 1;
    stageToName_abi_cxx11_(&msg,this,FragmentShader);
    poVar6 = std::operator<<((ostream *)&errLog,(string *)&msg);
    std::operator<<(poVar6,"\n");
LAB_00bea943:
    std::__cxx11::string::~string((string *)&msg);
  }
  else {
    if (iVar4 != 1) {
      if (iVar4 != 2) goto LAB_00bea964;
      poVar6 = std::operator<<((ostream *)&errLog,"### dump of ");
      stageToName_abi_cxx11_(&msg,this,ComputeShader);
      poVar6 = std::operator<<(poVar6,(string *)&msg);
      std::operator<<(poVar6,"###\n");
      std::__cxx11::string::~string((string *)&msg);
      uVar7 = 2;
      stageToName_abi_cxx11_(&msg,this,ComputeShader);
      poVar6 = std::operator<<((ostream *)&errLog,(string *)&msg);
      std::operator<<(poVar6,"\n");
      goto LAB_00bea943;
    }
    poVar6 = std::operator<<((ostream *)&errLog,"### dump of ");
    stageToName_abi_cxx11_(&msg,this,VertexShader);
    poVar6 = std::operator<<(poVar6,(string *)&msg);
    std::operator<<(poVar6,"###\n");
    std::__cxx11::string::~string((string *)&msg);
    uVar7 = 0;
  }
  iVar4 = (*this->m_contextSupplier->_vptr_IProgramContextSupplier[5])
                    (this->m_contextSupplier,(ulong)uVar7);
  std::operator<<((ostream *)&errLog,(string *)CONCAT44(extraout_var_02,iVar4));
LAB_00bea964:
  std::__cxx11::stringbuf::str();
  StringStream::~StringStream(&errLog);
  return __return_storage_ptr__;
}

Assistant:

String getErrorLog(bool dumpShaders = false)
	{
		StringStream errLog;

		if (getStage() != ComputeShader)
		{
			const glu::ShaderInfo& fragmentShaderInfo = m_program->getShaderInfo(glu::SHADERTYPE_FRAGMENT);
			const glu::ShaderInfo& vertexShaderInfo   = m_program->getShaderInfo(glu::SHADERTYPE_VERTEX);

			if (!fragmentShaderInfo.compileOk || !m_program->getProgramInfo().linkOk || dumpShaders)
			{
				errLog << "### dump of " << stageToName(FragmentShader) << "###\n";
				String msg((dumpShaders ? "Fragment shader should not have compiled" :
										  "Vertex shader compile failed while testing "));
				errLog << "Fragment shader compile failed while testing " << stageToName(getStage()) << ": "
					   << fragmentShaderInfo.infoLog << "\n";
				errLog << m_contextSupplier.getSource(FragmentShader);
			}
			if (!vertexShaderInfo.compileOk || !m_program->getProgramInfo().linkOk || dumpShaders)
			{
				errLog << "### dump of " << stageToName(VertexShader) << "###\n";
				String msg((dumpShaders ? "Vertex shader should not have compiled" :
										  "Vertex shader compile failed while testing "));
				errLog << msg << stageToName(getStage()) << ": " << vertexShaderInfo.infoLog << "\n";
				errLog << m_contextSupplier.getSource(VertexShader);
			}
		}
		else
		{
			const glu::ShaderInfo& computeShaderInfo = m_program->getShaderInfo(glu::SHADERTYPE_COMPUTE);

			if (!computeShaderInfo.compileOk || !m_program->getProgramInfo().linkOk || dumpShaders)
			{
				errLog << "### dump of " << stageToName(ComputeShader) << "###\n";
				String msg((dumpShaders ? "Compute shader should not have compiled" :
										  "Compute shader compile failed while testing "));
				errLog << msg << stageToName(ComputeShader) << ": " << computeShaderInfo.infoLog << "\n";
				errLog << m_contextSupplier.getSource(ComputeShader);
			}
		}
		if (!m_program->getProgramInfo().linkOk)
		{
			getStage();
			errLog << "Linking failed while testing " << stageToName(getStage()) << ": "
				   << m_program->getProgramInfo().infoLog << "\n";
			errLog << "### other stages ###\n";
			switch (getStage())
			{
			case FragmentShader:
				errLog << "### dump of " << stageToName(VertexShader) << "###\n";
				errLog << m_contextSupplier.getSource(VertexShader);
				break;
			case VertexShader:
				errLog << "### dump of " << stageToName(FragmentShader) << "###\n";
				errLog << stageToName(FragmentShader) << "\n";
				errLog << m_contextSupplier.getSource(FragmentShader);
				break;
			case ComputeShader:
				errLog << "### dump of " << stageToName(ComputeShader) << "###\n";
				errLog << stageToName(ComputeShader) << "\n";
				errLog << m_contextSupplier.getSource(ComputeShader);
				break;
			default:
				DE_ASSERT(0);
				break;
			}
		}
		return errLog.str();
	}